

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall
GraphTestCycleWithLengthZeroFromDepfile::Run(GraphTestCycleWithLengthZeroFromDepfile *this)

{
  Test *pTVar1;
  bool bVar2;
  bool condition;
  Node *pNVar3;
  Edge *pEVar4;
  size_type sVar5;
  reference ppNVar6;
  string *__rhs;
  allocator<char> local_e9;
  string local_e8;
  Edge *local_c8;
  Edge *edge;
  string local_b8;
  undefined1 local_98 [8];
  string err;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ManifestParserOptions local_18;
  GraphTestCycleWithLengthZeroFromDepfile *local_10;
  GraphTestCycleWithLengthZeroFromDepfile *this_local;
  
  local_10 = this;
  ManifestParserOptions::ManifestParserOptions(&local_18);
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule deprule\n   depfile = dep.d\n   command = unused\nbuild a b: deprule\n",local_18
             );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dep.d",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"a: b\n",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
  VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)local_98);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"a",(allocator<char> *)((long)&edge + 7));
  pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_b8);
  bVar2 = DependencyScan::RecomputeDirty
                    (&(this->super_GraphTest).scan_,pNVar3,
                     (vector<Node_*,_std::allocator<Node_*>_> *)0x0,(string *)local_98);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc",
             0x1b2,"scan_.RecomputeDirty(GetNode(\"a\"), NULL, &err)");
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&edge + 7));
  pTVar1 = g_current_test;
  bVar2 = std::operator==("dependency cycle: b -> b",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_98);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
                     ,0x1b3,"\"dependency cycle: b -> b\" == err");
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"a",&local_e9);
    pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_e8);
    pEVar4 = Node::in_edge(pNVar3);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    pTVar1 = g_current_test;
    local_c8 = pEVar4;
    sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&pEVar4->inputs_);
    testing::Test::Check
              (pTVar1,sVar5 == 1,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x1b9,"1 == edge->inputs_.size()");
    pTVar1 = g_current_test;
    ppNVar6 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_c8->inputs_,0);
    __rhs = Node::path_abi_cxx11_(*ppNVar6);
    condition = std::operator==("b",__rhs);
    testing::Test::Check
              (pTVar1,condition,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x1ba,"\"b\" == edge->inputs_[0]->path()");
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  edge._0_4_ = (uint)!bVar2;
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

TEST_F(GraphTest, CycleWithLengthZeroFromDepfile) {
  AssertParse(&state_,
"rule deprule\n"
"   depfile = dep.d\n"
"   command = unused\n"
"build a b: deprule\n"
  );
  fs_.Create("dep.d", "a: b\n");

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("a"), NULL, &err));
  ASSERT_EQ("dependency cycle: b -> b", err);

  // Despite the depfile causing edge to be a cycle (it has outputs a and b,
  // but the depfile also adds b as an input), the deps should have been loaded
  // only once:
  Edge* edge = GetNode("a")->in_edge();
  EXPECT_EQ(1, edge->inputs_.size());
  EXPECT_EQ("b", edge->inputs_[0]->path());
}